

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

char * wm_strdup(char *str)

{
  size_t sVar1;
  char *d;
  size_t l;
  char *str_local;
  
  sVar1 = strlen(str);
  str_local = (char *)malloc(sVar1 + 5);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    strcpy(str_local,str);
  }
  return str_local;
}

Assistant:

static char *wm_strdup (const char *str) {
	size_t l = strlen(str) + 5;
	char *d = (char *) malloc(l * sizeof(char));
	if (d) {
		strcpy(d, str);
		return d;
	}
	return NULL;
}